

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layoutnode.h
# Opt level: O2

void __thiscall rengine::LayoutNode::setLayoutTypeAsInt(LayoutNode *this,int layoutType)

{
  if (3 < (uint)layoutType) {
    __assert_fail("layoutType >= 0 && layoutType < LayoutEngine::LastLayoutType",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/scenegraph/layoutnode.h"
                  ,0xbf,"void rengine::LayoutNode::setLayoutTypeAsInt(int)");
  }
  if (((byte)this->field_0x5c & 3) == layoutType) {
    return;
  }
  setLayoutType(this,layoutType);
  Signal<>::emit(&onLayoutTypeAsIntChanged,(SignalEmitter *)this);
  return;
}

Assistant:

void setLayoutTypeAsInt(int layoutType) {
        assert(layoutType >= 0 && layoutType < LayoutEngine::LastLayoutType);
        if (layoutType == m_engine.layoutType)
            return;
        setLayoutType((LayoutEngine::LayoutType) layoutType);
        onLayoutTypeAsIntChanged.emit(this);
    }